

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

void __thiscall QPDFNameTreeObjectHelper::iterator::updateIValue(iterator *this)

{
  bool bVar1;
  pointer pTVar2;
  element_type p;
  NNTreeIterator local_98;
  string local_30;
  
  bVar1 = NNTreeIterator::valid
                    ((this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (bVar1) {
    NNTreeIterator::NNTreeIterator
              (&local_98,
               (this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pTVar2 = NNTreeIterator::operator->(&local_98);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_30,&pTVar2->first);
    std::__cxx11::string::operator=((string *)&this->ivalue,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pTVar2 = NNTreeIterator::operator->(&local_98);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&(this->ivalue).second,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pTVar2->second);
    NNTreeIterator::~NNTreeIterator(&local_98);
  }
  else {
    std::__cxx11::string::assign((char *)&this->ivalue);
    local_98._vptr_NNTreeIterator = (_func_int **)0x0;
    local_98.impl = (NNTreeImpl *)0x0;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&(this->ivalue).second,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.impl);
  }
  return;
}

Assistant:

void
QPDFNameTreeObjectHelper::iterator::updateIValue()
{
    if (impl->valid()) {
        auto p = *impl;
        this->ivalue.first = p->first.getUTF8Value();
        this->ivalue.second = p->second;
    } else {
        this->ivalue.first = "";
        this->ivalue.second = QPDFObjectHandle();
    }
}